

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::MultDivideMod(Forth *this)

{
  uint uVar1;
  anon_union_8_2_340ac67b_for_data_ local_70;
  SDCell reminder;
  SDCell quotent;
  SDCell n1;
  allocator<char> local_41;
  string local_40;
  anon_union_8_2_340ac67b_for_data_ local_20;
  SDCell n2;
  SDCell n3;
  Forth *this_local;
  
  requireDStackDepth(this,3,"*/MOD");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  SDCell::SDCell(&n2,(long)(int)uVar1);
  ForthStack<unsigned_int>::pop(&this->dStack);
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  SDCell::SDCell((SDCell *)&local_20.Cells,(long)(int)uVar1);
  if (n2.data_.Cells.lo == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"*/: zero divisor",&local_41);
    throwCppExceptionMessage(this,&local_40,errorDivisionByZero);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack,1);
  SDCell::SDCell(&quotent,(long)(int)uVar1);
  SDCell::SDCell(&reminder,
                 ((long)quotent.data_ * local_20.Dcells) /
                 CONCAT44(n2.data_.Cells.hi,n2.data_.Cells.lo));
  SDCell::SDCell((SDCell *)&local_70.Cells,
                 ((long)quotent.data_ * local_20.Dcells) %
                 CONCAT44(n2.data_.Cells.hi,n2.data_.Cells.lo));
  ForthStack<unsigned_int>::setTop(&this->dStack,1,local_70.Cells.lo);
  ForthStack<unsigned_int>::setTop(&this->dStack,0,reminder.data_.Cells.lo);
  return;
}

Assistant:

void MultDivideMod(){
			REQUIRE_DSTACK_DEPTH(3, "*/MOD");
			SDCell n3(static_cast<SCell>(dStack.getTop())); dStack.pop();
			SDCell n2(static_cast<SCell>(dStack.getTop())); 
			RUNTIME_ERROR_IF(n3.data_.Cells.lo == 0, "*/: zero divisor", errorDivisionByZero);
			SDCell n1(static_cast<SCell>( dStack.getTop(1)));
			SDCell quotent( (n1.data_.Dcells*n2.data_.Dcells) / n3.data_.Dcells );
			SDCell reminder( (n1.data_.Dcells*n2.data_.Dcells) % n3.data_.Dcells );
			dStack.setTop(1, reminder.data_.Cells.lo);
			dStack.setTop(0, quotent.data_.Cells.lo);
		}